

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_Error tt_cmap2_validate(FT_Byte *table,FT_Validator valid)

{
  FT_Byte FVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  FT_Byte *pFVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  long lVar10;
  ushort *puVar11;
  ushort *puVar12;
  ushort *puVar13;
  bool bVar14;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  uVar4 = *(ushort *)(table + 2) << 8 | *(ushort *)(table + 2) >> 8;
  if ((uVar4 < 0x206) || (valid->limit < table + uVar4)) {
    ft_validator_error(valid,8);
  }
  lVar10 = 0;
  uVar7 = 0;
  do {
    FVar1 = table[lVar10 * 2 + 6];
    bVar2 = table[lVar10 * 2 + 7];
    if ((FT_VALIDATE_TIGHT < valid->level) && ((bVar2 & 7) != 0)) {
      ft_validator_error(valid,8);
    }
    uVar8 = (uint)(ushort)(CONCAT11(FVar1,bVar2) >> 3);
    if (uVar8 <= uVar7) {
      uVar8 = uVar7;
    }
    uVar7 = uVar8;
    lVar10 = lVar10 + 1;
  } while ((int)lVar10 != 0x100);
  if (valid->limit < table + (ulong)uVar7 * 8 + 0x20e) {
    ft_validator_error(valid,8);
  }
  puVar13 = (ushort *)(table + 0x206);
  uVar8 = 0;
  do {
    uVar6 = puVar13[1] << 8 | puVar13[1] >> 8;
    puVar12 = puVar13 + 4;
    if (uVar6 != 0) {
      uVar3 = puVar13[2];
      uVar9 = puVar13[3];
      if ((FT_VALIDATE_TIGHT < valid->level) &&
         (((char)*puVar13 != '\0' || (0x100 - *(byte *)((long)puVar13 + 1) < (uint)uVar6)))) {
        ft_validator_error(valid,8);
      }
      uVar9 = uVar9 << 8 | uVar9 >> 8;
      if (uVar9 != 0) {
        pFVar5 = (FT_Byte *)((long)puVar13 + (ulong)uVar9 + 6);
        if ((pFVar5 < table + (ulong)uVar7 * 8 + 0x20e) ||
           (table + uVar4 < pFVar5 + (uint)uVar6 * 2)) {
          ft_validator_error(valid,9);
        }
        if (valid->level != FT_VALIDATE_DEFAULT) {
          do {
            puVar11 = puVar12;
            uVar9 = *puVar11 << 8 | *puVar11 >> 8;
            if ((uVar9 != 0) &&
               ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
                ((uint)uVar9 + (uint)(ushort)(uVar3 << 8 | uVar3 >> 8) & 0xffff))) {
              ft_validator_error(valid,0x10);
            }
            puVar12 = puVar11 + 1;
          } while (puVar11 + 1 < (ushort *)((long)puVar13 + (ulong)((uint)uVar6 * 2) + 8));
          puVar12 = puVar11 + 1;
        }
      }
    }
    bVar14 = uVar8 != uVar7;
    puVar13 = puVar12;
    uVar8 = uVar8 + 1;
  } while (bVar14);
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap2_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;

    FT_UInt   n, max_subs;
    FT_Byte*  keys;        /* keys table     */
    FT_Byte*  subs;        /* sub-headers    */
    FT_Byte*  glyph_ids;   /* glyph ID array */


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 6 + 512 )
      FT_INVALID_TOO_SHORT;

    keys = table + 6;

    /* parse keys to compute sub-headers count */
    p        = keys;
    max_subs = 0;
    for ( n = 0; n < 256; n++ )
    {
      FT_UInt  idx = TT_NEXT_USHORT( p );


      /* value must be multiple of 8 */
      if ( valid->level >= FT_VALIDATE_PARANOID && ( idx & 7 ) != 0 )
        FT_INVALID_DATA;

      idx >>= 3;

      if ( idx > max_subs )
        max_subs = idx;
    }

    FT_ASSERT( p == table + 518 );

    subs      = p;
    glyph_ids = subs + ( max_subs + 1 ) * 8;
    if ( glyph_ids > valid->limit )
      FT_INVALID_TOO_SHORT;

    /* parse sub-headers */
    for ( n = 0; n <= max_subs; n++ )
    {
      FT_UInt  first_code, code_count, offset;
      FT_Int   delta;


      first_code = TT_NEXT_USHORT( p );
      code_count = TT_NEXT_USHORT( p );
      delta      = TT_NEXT_SHORT( p );
      offset     = TT_NEXT_USHORT( p );

      /* many Dynalab fonts have empty sub-headers */
      if ( code_count == 0 )
        continue;

      /* check range within 0..255 */
      if ( valid->level >= FT_VALIDATE_PARANOID )
      {
        if ( first_code >= 256 || code_count > 256 - first_code )
          FT_INVALID_DATA;
      }

      /* check offset */
      if ( offset != 0 )
      {
        FT_Byte*  ids;


        ids = p - 2 + offset;
        if ( ids < glyph_ids || ids + code_count * 2 > table + length )
          FT_INVALID_OFFSET;

        /* check glyph IDs */
        if ( valid->level >= FT_VALIDATE_TIGHT )
        {
          FT_Byte*  limit = p + code_count * 2;
          FT_UInt   idx;


          for ( ; p < limit; )
          {
            idx = TT_NEXT_USHORT( p );
            if ( idx != 0 )
            {
              idx = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
              if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
                FT_INVALID_GLYPH_ID;
            }
          }
        }
      }
    }

    return FT_Err_Ok;
  }